

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::InnerMap::Resize(InnerMap *this,size_t new_num_buckets)

{
  ulong n;
  bool bVar1;
  void **ppvVar2;
  size_type sVar3;
  LogMessage *other;
  void **ppvVar4;
  ulong local_88;
  size_type i;
  size_type start;
  size_type old_table_size;
  void **old_table;
  byte local_51;
  LogMessage local_50;
  size_t local_18;
  size_t new_num_buckets_local;
  InnerMap *this_local;
  
  local_18 = new_num_buckets;
  new_num_buckets_local = (size_t)this;
  if (this->num_buckets_ == 1) {
    this->index_of_first_non_null_ = 8;
    this->num_buckets_ = 8;
    ppvVar2 = CreateEmptyTable(this,this->num_buckets_);
    this->table_ = ppvVar2;
    sVar3 = Seed(this);
    this->seed_ = sVar3;
  }
  else {
    local_51 = 0;
    if (new_num_buckets < 8) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                 ,0x3a0);
      local_51 = 1;
      other = internal::LogMessage::operator<<
                        (&local_50,"CHECK failed: (new_num_buckets) >= (kMinTableSize): ");
      internal::LogFinisher::operator=((LogFinisher *)((long)&old_table + 3),other);
    }
    if ((local_51 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_50);
    }
    ppvVar2 = this->table_;
    n = this->num_buckets_;
    this->num_buckets_ = local_18;
    ppvVar4 = CreateEmptyTable(this,this->num_buckets_);
    this->table_ = ppvVar4;
    local_88 = this->index_of_first_non_null_;
    this->index_of_first_non_null_ = this->num_buckets_;
    for (; local_88 < n; local_88 = local_88 + 1) {
      bVar1 = internal::TableEntryIsNonEmptyList(ppvVar2,local_88);
      if (bVar1) {
        TransferList(this,ppvVar2,local_88);
      }
      else {
        bVar1 = internal::TableEntryIsTree(ppvVar2,local_88);
        if (bVar1) {
          TransferTree(this,ppvVar2,local_88);
          local_88 = local_88 + 1;
        }
      }
    }
    Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::Dealloc<void*>
              ((InnerMap *)this,ppvVar2,n);
  }
  return;
}

Assistant:

void Resize(size_t new_num_buckets) {
      if (num_buckets_ == internal::kGlobalEmptyTableSize) {
        // This is the global empty array.
        // Just overwrite with a new one. No need to transfer or free anything.
        num_buckets_ = index_of_first_non_null_ = kMinTableSize;
        table_ = CreateEmptyTable(num_buckets_);
        seed_ = Seed();
        return;
      }

      GOOGLE_DCHECK_GE(new_num_buckets, kMinTableSize);
      void** const old_table = table_;
      const size_type old_table_size = num_buckets_;
      num_buckets_ = new_num_buckets;
      table_ = CreateEmptyTable(num_buckets_);
      const size_type start = index_of_first_non_null_;
      index_of_first_non_null_ = num_buckets_;
      for (size_type i = start; i < old_table_size; i++) {
        if (internal::TableEntryIsNonEmptyList(old_table, i)) {
          TransferList(old_table, i);
        } else if (internal::TableEntryIsTree(old_table, i)) {
          TransferTree(old_table, i++);
        }
      }
      Dealloc<void*>(old_table, old_table_size);
    }